

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O1

int main(void)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  CMUnitTest tests [68];
  CMUnitTest aCStack_aa8 [68];
  
  puVar1 = (uint *)cpuid_Version_info(1);
  uVar5 = (ulong)puVar1[3];
  uVar3 = *puVar1 >> 4;
  if (uVar3 < 0x406c) {
    if (uVar3 < 0x2065) {
      if (uVar3 < 0x266) {
        if (uVar3 < 0x6d) {
          uVar5 = (ulong)(uVar3 - 99);
          if (uVar3 - 99 < 2) {
            pcVar7 = "Prescott";
            goto LAB_001075b6;
          }
          if (uVar3 == 0x66) {
            pcVar7 = "Presler";
            goto LAB_001075b6;
          }
        }
        else {
          if (uVar3 == 0x6d) {
            pcVar7 = "Dothan";
            goto LAB_001075b6;
          }
          if (uVar3 == 0x6f) goto switchD_00107363_caseD_0;
          if (uVar3 == 0x16c) {
            pcVar7 = "Pineview";
            goto LAB_001075b6;
          }
        }
      }
      else {
        uVar6 = (ulong)(uVar3 - 0x1066);
        if (uVar3 - 0x1066 < 9) {
          uVar5 = (long)&switchD_00107363::switchdataD_00137020 +
                  (long)(int)(&switchD_00107363::switchdataD_00137020)[uVar6];
          switch(uVar6) {
          case 0:
switchD_00107363_caseD_0:
            pcVar7 = "Merom";
            goto LAB_001075b6;
          case 1:
          case 7:
            pcVar7 = "Penryn";
            goto LAB_001075b6;
          case 4:
          case 8:
switchD_00107363_caseD_4:
            pcVar7 = "Nehalem";
            goto LAB_001075b6;
          }
        }
        else {
          uVar5 = uVar6;
          if (uVar3 == 0x266) {
            pcVar7 = "Lincroft";
            goto LAB_001075b6;
          }
          if (uVar3 == 0x366) {
            pcVar7 = "Cedarview";
            goto LAB_001075b6;
          }
        }
      }
    }
    else if (uVar3 < 0x306a) {
      uVar3 = uVar3 - 0x2065;
      if (uVar3 < 0xb) {
        uVar5 = 0x481;
        if ((0x481U >> (uVar3 & 0x1f) & 1) != 0) {
          pcVar7 = "Westmere";
          goto LAB_001075b6;
        }
        uVar5 = 0x120;
        if ((0x120U >> (uVar3 & 0x1f) & 1) != 0) {
          pcVar7 = "SandyBridge";
          goto LAB_001075b6;
        }
        if (uVar3 == 9) goto switchD_00107363_caseD_4;
      }
    }
    else if (uVar3 < 0x306d) {
      if (uVar3 == 0x306a) {
        pcVar7 = "IvyBridge";
        goto LAB_001075b6;
      }
      if (uVar3 == 0x306c) {
        pcVar7 = "Haswell";
        goto LAB_001075b6;
      }
    }
    else {
      if (uVar3 == 0x306d) {
        pcVar7 = "Broadwell";
        goto LAB_001075b6;
      }
      if (uVar3 == 0x30f1) goto LAB_00107549;
    }
  }
  else if (uVar3 < 0x9067) {
    if (uVar3 < 0x706a) {
      if (uVar3 < 0x606a) {
        if (uVar3 == 0x406c) {
          pcVar7 = "CherryTrail";
          goto LAB_001075b6;
        }
        if (uVar3 == 0x506c) goto LAB_001074e9;
        if (uVar3 == 0x506e) {
          pcVar7 = "Skylake";
          goto LAB_001075b6;
        }
      }
      else {
        if (uVar3 == 0x606a) {
LAB_001074f5:
          pcVar7 = "Icelake";
          goto LAB_001075b6;
        }
        if ((uVar3 == 0x60f0) || (uVar3 == 0x60f8)) {
LAB_00107549:
          pcVar7 = "Zen2";
          goto LAB_001075b6;
        }
      }
    }
    else if (uVar3 < 0x806c) {
      if (uVar3 == 0x706a) {
LAB_001074e9:
        pcVar7 = "Goldmont";
        goto LAB_001075b6;
      }
      if (uVar3 == 0x706e) goto LAB_001074f5;
      if (uVar3 == 0x70f1) goto LAB_00107549;
    }
    else {
      uVar5 = (ulong)(uVar3 - 0x806c);
      if (uVar3 - 0x806c < 2) {
        pcVar7 = "TigerLake";
        goto LAB_001075b6;
      }
      if (uVar3 == 0x806e) {
LAB_00107559:
        pcVar7 = "Kabylake";
        goto LAB_001075b6;
      }
    }
  }
  else if (uVar3 < 0xa067) {
    if (uVar3 < 0x90f0) {
      if ((uVar3 == 0x9067) || (uVar3 == 0x906a)) {
        pcVar7 = "Alderlake";
        goto LAB_001075b6;
      }
      if (uVar3 == 0x906e) goto LAB_00107559;
    }
    else {
      uVar5 = (ulong)(uVar3 - 0xa065);
      if (uVar3 - 0xa065 < 2) {
        pcVar7 = "Cometlake";
        goto LAB_001075b6;
      }
      if (uVar3 == 0x90f0) goto LAB_00107549;
    }
  }
  else if (uVar3 < 0x40f40) {
    if (uVar3 == 0xa067) {
      pcVar7 = "Rocketlake";
      goto LAB_001075b6;
    }
    if (uVar3 == 0xb067) {
      pcVar7 = "Raptorlake";
      goto LAB_001075b6;
    }
    if (uVar3 == 0x20f10) goto LAB_00107501;
  }
  else {
    if (uVar3 == 0x40f40) {
      pcVar7 = "Zen3+";
      goto LAB_001075b6;
    }
    if (uVar3 == 0x50f00) {
LAB_00107501:
      pcVar7 = "Zen3";
      goto LAB_001075b6;
    }
    if (uVar3 == 0x60f10) {
      pcVar7 = "Zen4";
      goto LAB_001075b6;
    }
  }
  pcVar7 = "unknown";
LAB_001075b6:
  printf("x64 processor:  %s\t",pcVar7,(ulong)puVar1[2],uVar5);
  printf(" compiler version: %s\t",
         "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
        );
  putchar(10);
  lVar2 = cpuid(0x80000006);
  if ((char)*(undefined4 *)(lVar2 + 0xc) != '@') {
    lVar2 = cpuid(0x80000006);
    printf("cache line: %d bytes\n",(ulong)(byte)*(undefined4 *)(lVar2 + 0xc),
           (ulong)*(uint *)(lVar2 + 8));
  }
  memcpy(aCStack_aa8,&PTR_anon_var_dwarf_e0b1_0014f2b0,0xaa0);
  iVar4 = _cmocka_run_group_tests
                    ("tests",aCStack_aa8,0x44,(CMFixtureFunction)0x0,(CMFixtureFunction)0x0);
  return iVar4;
}

Assistant:

int main() {
    roaring::misc::tellmeall();
    const struct CMUnitTest tests[] = {
        cmocka_unit_test(fuzz_001),
        cmocka_unit_test(test_bitmap_of_32),
        cmocka_unit_test(test_bitmap_of_64),
        cmocka_unit_test(serial_test),
#if !CROARING_IS_BIG_ENDIAN
        cmocka_unit_test(test_example_true),
        cmocka_unit_test(test_example_false),
        cmocka_unit_test(test_example_cpp_true),
        cmocka_unit_test(test_example_cpp_false),
        cmocka_unit_test(test_example_cpp_64_true),
        cmocka_unit_test(test_example_cpp_64_false),
#endif
        cmocka_unit_test(test_cpp_add_remove_checked),
        cmocka_unit_test(test_cpp_add_remove_checked_64),
        cmocka_unit_test(test_cpp_add_range),
        cmocka_unit_test(test_cpp_remove_range),
        cmocka_unit_test(test_cpp_add_range_closed_64),
        cmocka_unit_test(test_cpp_add_range_open_64),
        cmocka_unit_test(test_cpp_add_range_closed_large_64),
        cmocka_unit_test(test_cpp_add_range_open_large_64),
        cmocka_unit_test(test_cpp_add_many),
        cmocka_unit_test(test_cpp_add_many_64),
        cmocka_unit_test(test_cpp_add_range_closed_combinatoric_64),
        cmocka_unit_test(test_cpp_add_bulk),
        cmocka_unit_test(test_cpp_contains_bulk),
        cmocka_unit_test(test_cpp_rank_many),
        cmocka_unit_test(test_cpp_remove_range_closed_64),
        cmocka_unit_test(test_cpp_remove_range_64),
        cmocka_unit_test(test_run_compression_cpp_64_true),
        cmocka_unit_test(test_run_compression_cpp_64_false),
        cmocka_unit_test(test_run_compression_cpp_true),
        cmocka_unit_test(test_run_compression_cpp_false),
        cmocka_unit_test(test_cpp_union_64),
        cmocka_unit_test(test_cpp_intersect_64),
        cmocka_unit_test(test_cpp_difference_64),
        cmocka_unit_test(test_cpp_xor_64),
        cmocka_unit_test(test_cpp_clear_64),
        cmocka_unit_test(test_cpp_move_64),
        cmocka_unit_test(test_roaring64_iterate_multi_roaring),
        cmocka_unit_test(test_roaring64_remove_32),
        cmocka_unit_test(test_roaring64_add_and_remove),
        cmocka_unit_test(test_cpp_bidirectional_iterator_64),
        cmocka_unit_test(test_cpp_frozen),
        cmocka_unit_test(test_cpp_frozen_64),
        cmocka_unit_test(test_cpp_frozen_portable),
        cmocka_unit_test(test_cpp_frozen_64_portable),
        cmocka_unit_test(test_cpp_flip),
        cmocka_unit_test(test_cpp_flip_closed),
        cmocka_unit_test(test_cpp_flip_64),
        cmocka_unit_test(test_cpp_flip_closed_64),
        cmocka_unit_test(test_combinatoric_flip_many_64),
#if !CROARING_IS_BIG_ENDIAN
        cmocka_unit_test(test_cpp_deserialize_64_empty),
        cmocka_unit_test(test_cpp_deserialize_64_32bit_vals),
        cmocka_unit_test(test_cpp_deserialize_64_spread_vals),
        cmocka_unit_test(test_cpp_deserialize_64_high_vals),
        cmocka_unit_test(test_cpp_deserialize_add_offset),
#if ROARING_EXCEPTIONS
        cmocka_unit_test(test_cpp_deserialize_64_empty_input),
        cmocka_unit_test(test_cpp_deserialize_64_size_too_small),
        cmocka_unit_test(test_cpp_deserialize_64_invalid_size),
        cmocka_unit_test(test_cpp_deserialize_64_key_too_small),
#endif
#endif  // !CROARING_IS_BIG_ENDIAN
        cmocka_unit_test(issue316),
        cmocka_unit_test(test_issue304),
        cmocka_unit_test(issue_336),
        cmocka_unit_test(issue_372),
        cmocka_unit_test(test_cpp_is_subset_64),
        cmocka_unit_test(test_cpp_fast_union_64),
        cmocka_unit_test(test_cpp_to_string),
        cmocka_unit_test(test_cpp_remove_run_compression),
        cmocka_unit_test(test_cpp_contains_range_interleaved_containers),
        cmocka_unit_test(test_cpp_copy_map_iterator_to_different_map),
    };
    return cmocka_run_group_tests(tests, NULL, NULL);
}